

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr.c
# Opt level: O2

int raplcap_pd_set_limits
              (raplcap *rc,uint32_t pkg,uint32_t die,raplcap_zone zone,raplcap_limit *limit_long,
              raplcap_limit *limit_short)

{
  int iVar1;
  int iVar2;
  raplcap_msr *ctx;
  off_t msr;
  uint64_t msrval;
  raplcap_limit *local_40;
  raplcap_limit *local_38;
  
  local_40 = limit_long;
  local_38 = limit_short;
  ctx = get_state(rc,pkg,die);
  msr = zone_to_msr_offset(zone,ZONE_OFFSETS_PL);
  iVar2 = -1;
  if (-1 < msr && ctx != (raplcap_msr *)0x0) {
    iVar1 = msr_sys_read(ctx->sys,&msrval,pkg,die,msr);
    if (iVar1 == 0) {
      msrval = msr_set_limits(&ctx->ctx,zone,msrval,local_40,local_38);
      iVar2 = msr_sys_write(ctx->sys,msrval,pkg,die,msr);
    }
  }
  return iVar2;
}

Assistant:

int raplcap_pd_set_limits(const raplcap* rc, uint32_t pkg, uint32_t die, raplcap_zone zone,
                          const raplcap_limit* limit_long, const raplcap_limit* limit_short) {
  uint64_t msrval;
  const raplcap_msr* state = get_state(rc, pkg, die);
  const off_t msr = zone_to_msr_offset(zone, ZONE_OFFSETS_PL);
  raplcap_log(DEBUG, "raplcap_pd_set_limits: pkg=%"PRIu32", die=%"PRIu32", zone=%d\n", pkg, die, zone);
  if (state == NULL || msr < 0 || msr_sys_read(state->sys, &msrval, pkg, die, msr)) {
    return -1;
  }
  msrval = msr_set_limits(&state->ctx, zone, msrval, limit_long, limit_short);
  return msr_sys_write(state->sys, msrval, pkg, die, msr);
}